

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_tabpage_is_valid(Nvim *this,Tabpage tabpage)

{
  allocator local_39;
  string local_38;
  Tabpage local_18;
  Tabpage tabpage_local;
  Nvim *this_local;
  
  local_18 = tabpage;
  tabpage_local = (Tabpage)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_tabpage_is_valid",&local_39);
  NvimRPC::async_call<long>(&this->client_,&local_38,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::async_tabpage_is_valid(Tabpage tabpage) {
    client_.async_call("nvim_tabpage_is_valid", tabpage);
}